

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O1

uint16_t __thiscall hrgls::API::GetVerbosity(API *this)

{
  API_private *pAVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  uint16_t ret;
  uint16_t local_22;
  key_type local_20;
  
  local_22 = 0;
  if (this->m_private == (API_private *)0x0) {
    local_22 = 0;
  }
  else {
    mVar2 = hrgls_APIGetVerbosity(this->m_private->m_api,&local_22);
    pAVar1 = this->m_private;
    local_20._M_thread = pthread_self();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_20);
    *pmVar3 = mVar2;
  }
  return local_22;
}

Assistant:

uint16_t API::GetVerbosity() const
  {
    uint16_t ret = 0;
    if (!m_private) {
      return ret;
    }

    m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetVerbosity(m_private->m_api, &ret);
    return ret;
  }